

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TStokesAnalytic::uxy<double>(TStokesAnalytic *this,TPZVec<double> *x,TPZVec<double> *flux)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a8;
  double local_88;
  double local_38;
  
  if (0xc < this->fExactSol - EKovasznay) {
switchD_0140f279_caseD_8:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x8c0);
  }
  pdVar2 = x->fStore;
  dVar13 = *pdVar2;
  dVar1 = pdVar2[1];
  dVar11 = pdVar2[2];
  switch(this->fExactSol) {
  default:
    dVar12 = 1.0 / this->fvisco;
    dVar11 = this->Pi * 4.0 * this->Pi + dVar12 * dVar12 * 0.25;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar11 = dVar12 * 0.5 - dVar11;
    dVar13 = dVar13 * dVar11;
    dVar12 = ::exp(dVar13);
    dVar4 = cos((this->Pi + this->Pi) * dVar1);
    *flux->fStore = 1.0 - dVar4 * dVar12;
    dVar12 = this->Pi;
    local_88 = ::exp(dVar13);
    local_88 = local_88 * (dVar11 / (dVar12 + dVar12));
    dVar13 = sin((this->Pi + this->Pi) * dVar1);
    goto LAB_0140fa9e;
  case ESinCos:
    dVar11 = sin(dVar13);
    dVar12 = sin(dVar1);
    *flux->fStore = dVar12 * -dVar11;
    local_88 = cos(dVar13);
    local_88 = -local_88;
    dVar13 = cos(dVar1);
    goto LAB_0140fa9e;
  case ENoFlow:
    pdVar2 = flux->fStore;
    *pdVar2 = dVar13 * 0.0;
    pdVar2[1] = dVar13 * 0.0;
    break;
  case ESinCos3D:
    dVar12 = sin(dVar13);
    dVar4 = sin(dVar1);
    *flux->fStore = dVar4 * -dVar12;
    local_88 = cos(dVar13);
    local_88 = -local_88;
    dVar13 = cos(dVar1);
    dVar12 = sin(dVar1);
    dVar4 = sin(dVar11);
    flux->fStore[1] = dVar13 * local_88 - dVar4 * dVar12;
    local_a8 = cos(dVar1);
    local_a8 = -local_a8;
    goto LAB_0140f727;
  case EPconst:
    pdVar2 = flux->fStore;
    *pdVar2 = dVar13;
    pdVar2[1] = -dVar1;
    break;
  case EObstacles:
  case EOneCurve:
    goto switchD_0140f279_caseD_8;
  case ESinCosBDS:
    dVar11 = ::exp(this->fcBrinkman / this->fvisco);
    dVar11 = 1.0 / dVar11;
    uVar3 = (ulong)DAT_014f8310;
    dVar12 = sin(dVar13);
    dVar4 = sin(dVar1);
    dVar5 = sin(dVar13);
    dVar6 = sin(dVar1);
    *flux->fStore = dVar6 * dVar5 * (1.0 - dVar11) - dVar4 * dVar12 * dVar11;
    dVar12 = cos(dVar13);
    dVar4 = cos(dVar1);
    dVar13 = cos(dVar13);
    dVar1 = cos(dVar1);
    dVar13 = dVar4 * dVar12 * (double)(uVar3 ^ (ulong)dVar11) - dVar13 * (1.0 - dVar11) * dVar1;
    goto LAB_0140faa4;
  case ESinCosBDS3D:
    dVar12 = ::exp(this->fcBrinkman / this->fvisco);
    dVar12 = 1.0 / dVar12;
    uVar3 = (ulong)DAT_014f8310;
    dVar4 = sin(dVar13);
    dVar5 = sin(dVar1);
    dVar6 = 1.0 - dVar12;
    dVar7 = sin(dVar13);
    dVar8 = sin(dVar1);
    *flux->fStore = dVar8 * dVar7 * dVar6 - dVar5 * dVar4 * dVar12;
    local_38 = cos(dVar13);
    local_38 = -local_38;
    dVar4 = cos(dVar1);
    dVar5 = sin(dVar1);
    dVar7 = sin(dVar11);
    dVar13 = cos(dVar13);
    dVar8 = cos(dVar1);
    dVar9 = sin(dVar1);
    dVar10 = sin(dVar11);
    flux->fStore[1] =
         (dVar4 * local_38 - dVar7 * dVar5) * dVar12 + (dVar10 * dVar9 - dVar8 * dVar13) * dVar6;
    dVar13 = cos(dVar1);
    dVar4 = cos(dVar11);
    dVar1 = cos(dVar1);
    dVar11 = cos(dVar11);
    flux->fStore[2] = dVar4 * dVar13 * (double)((ulong)dVar12 ^ uVar3) - dVar11 * dVar1 * dVar6;
    break;
  case EGatica3D:
    dVar12 = cos(this->Pi * dVar13);
    dVar4 = sin(this->Pi * dVar1);
    dVar5 = sin(this->Pi * dVar11);
    *flux->fStore = dVar5 * dVar4 * dVar12;
    dVar12 = sin(this->Pi * dVar13);
    dVar4 = cos(this->Pi * dVar1);
    dVar5 = sin(this->Pi * dVar11);
    flux->fStore[1] = dVar5 * dVar4 * dVar12;
    dVar13 = sin(dVar13 * this->Pi);
    local_a8 = sin(dVar1 * this->Pi);
    local_a8 = local_a8 * dVar13 * -2.0;
    dVar11 = dVar11 * this->Pi;
LAB_0140f727:
    dVar13 = cos(dVar11);
    flux->fStore[2] = dVar13 * local_a8;
    break;
  case ECouplingSD:
    if (0.0 <= dVar1) {
      if (dVar1 < 0.0) {
        return;
      }
      dVar11 = this->Pi;
      dVar12 = sin(dVar11 * dVar1);
      dVar4 = cos(this->Pi * dVar1);
      dVar5 = cos(dVar13);
      *flux->fStore = dVar5 * dVar4 * dVar12 * (2.0 / dVar11);
      dVar11 = this->Pi;
      dVar12 = sin(dVar11 * dVar1);
      dVar1 = sin(dVar1 * this->Pi);
      local_a8 = dVar1 * dVar12 * (1.0 / (dVar11 * dVar11)) + -2.0;
    }
    else {
      dVar11 = (double)((ulong)dVar1 ^ (ulong)DAT_014f8310);
      dVar12 = ::exp(dVar11);
      dVar4 = ::exp(dVar1);
      dVar5 = cos(dVar13);
      *flux->fStore = dVar5 * (dVar12 - dVar4);
      dVar11 = ::exp(dVar11);
      dVar1 = ::exp(dVar1);
      local_a8 = -(dVar1 + dVar11);
    }
    dVar13 = sin(dVar13);
    dVar13 = dVar13 * local_a8;
    goto LAB_0140faa4;
  case ECouplingNSD:
    if (1.0 <= dVar1) {
      if (dVar1 < 1.0) {
        return;
      }
      dVar11 = cos(this->Pi * dVar1 * 0.5);
      dVar12 = cos(this->Pi * dVar1 * 0.5);
      dVar4 = sin(this->Pi * dVar13 * 0.5);
      *flux->fStore = dVar4 * dVar12 * dVar11;
      local_88 = cos(dVar13 * this->Pi * 0.5);
      local_88 = -local_88;
      dVar13 = sin(this->Pi * dVar1);
      dVar13 = dVar13 * 0.25 + dVar1 * this->Pi * 0.25;
    }
    else {
      dVar11 = this->Pi;
      dVar12 = sin(dVar11 * dVar13 * 0.5);
      dVar4 = 1.0 - dVar1;
      dVar5 = sin(dVar4);
      *flux->fStore = dVar5 * dVar12 * dVar11 * -0.125 * dVar11 * dVar1;
      dVar11 = this->Pi;
      local_88 = cos(dVar13 * dVar11 * 0.5);
      local_88 = local_88 * dVar11 * 0.25;
      dVar11 = cos(dVar4);
      dVar13 = sin(dVar4);
      dVar13 = dVar13 - dVar11 * dVar1;
    }
LAB_0140fa9e:
    dVar13 = dVar13 * local_88;
LAB_0140faa4:
    flux->fStore[1] = dVar13;
  }
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}